

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetStep.c
# Opt level: O3

int Saig_ManRetimeSteps(Aig_Man_t *p,int nSteps,int fForward,int fAddBugs)

{
  Aig_Obj_t *pAVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  Aig_ManSetCioIds(p);
  Aig_ManFanoutStart(p);
  p->fCreatePios = 1;
  if (fForward == 0) {
    if (0 < nSteps) {
      iVar3 = 0;
      do {
        iVar6 = 0;
        if (0 < p->nRegs) {
          iVar6 = 0;
          do {
            uVar2 = p->nTruePis + iVar6;
            if (((int)uVar2 < 0) || (p->vCis->nSize <= (int)uVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pAVar1 = (Aig_Obj_t *)p->vCis->pArray[uVar2];
            pAVar4 = Saig_ManRetimeNodeBwd(p,pAVar1);
            if (pAVar4 != (Aig_Obj_t *)0x0) {
              Aig_ObjReplace(p,pAVar1,pAVar4,0);
              break;
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < p->nRegs);
        }
        iVar7 = iVar3;
      } while ((iVar6 != p->vObjs->nSize) && (iVar3 = iVar3 + 1, iVar7 = nSteps, iVar3 != nSteps));
      goto LAB_006f36c3;
    }
  }
  else {
    Saig_ManMarkAutonomous(p);
    if (0 < nSteps) {
      pVVar5 = p->vObjs;
      iVar3 = pVVar5->nSize;
      iVar6 = 0;
      do {
        if (iVar3 < 1) {
          lVar8 = 0;
        }
        else {
          lVar8 = 0;
          do {
            pAVar1 = (Aig_Obj_t *)pVVar5->pArray[lVar8];
            if ((pAVar1 != (Aig_Obj_t *)0x0) &&
               (0xfffffffd < (*(uint *)&pAVar1->field_0x18 & 7) - 7)) {
              pAVar4 = Saig_ManRetimeNodeFwd(p,pAVar1,(uint)(iVar6 == 10 && fAddBugs != 0));
              if (pAVar4 != (Aig_Obj_t *)0x0) {
                Aig_ObjReplace(p,pAVar1,pAVar4,0);
                pVVar5 = p->vObjs;
                break;
              }
              pVVar5 = p->vObjs;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < pVVar5->nSize);
        }
        iVar3 = pVVar5->nSize;
        iVar7 = iVar6;
      } while (((int)lVar8 != iVar3) && (iVar6 = iVar6 + 1, iVar7 = nSteps, iVar6 != nSteps));
      goto LAB_006f36c3;
    }
  }
  iVar7 = 0;
LAB_006f36c3:
  p->fCreatePios = 0;
  Aig_ManFanoutStop(p);
  iVar3 = Aig_ManCleanup(p);
  if (iVar3 != 0) {
    __assert_fail("RetValue == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetStep.c"
                  ,0xe1,"int Saig_ManRetimeSteps(Aig_Man_t *, int, int, int)");
  }
  Aig_ManSetRegNum(p,p->nRegs);
  return iVar7;
}

Assistant:

int Saig_ManRetimeSteps( Aig_Man_t * p, int nSteps, int fForward, int fAddBugs )
{
    Aig_Obj_t * pObj, * pObjNew;
    int RetValue, s, i;
    Aig_ManSetCioIds( p );
    Aig_ManFanoutStart( p );
    p->fCreatePios = 1;
    if ( fForward )
    {
        Saig_ManMarkAutonomous( p );
        for ( s = 0; s < nSteps; s++ )
        {
            Aig_ManForEachNode( p, pObj, i )
            {
                pObjNew = Saig_ManRetimeNodeFwd( p, pObj, fAddBugs && (s == 10) );
//                pObjNew = Saig_ManRetimeNodeFwd( p, pObj, 0 );
                if ( pObjNew == NULL )
                    continue;
                Aig_ObjReplace( p, pObj, pObjNew, 0 );
                break;
            }
            if ( i == Vec_PtrSize(p->vObjs) )
                break;
        }
    }
    else
    {
        for ( s = 0; s < nSteps; s++ )
        {
            Saig_ManForEachLo( p, pObj, i )
            {
                pObjNew = Saig_ManRetimeNodeBwd( p, pObj );
                if ( pObjNew == NULL )
                    continue;
                Aig_ObjReplace( p, pObj, pObjNew, 0 );
                break;
            }
            if ( i == Vec_PtrSize(p->vObjs) )
                break;
        }
    }
    p->fCreatePios = 0;
    Aig_ManFanoutStop( p );
    RetValue = Aig_ManCleanup( p );
    assert( RetValue == 0 );
    Aig_ManSetRegNum( p, p->nRegs ); 
    return s;
}